

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_FEA_loads_statics.cpp
# Opt level: O0

MyLoadCustom * __thiscall test_1::MyLoadCustom::Clone(MyLoadCustom *this)

{
  MyLoadCustom *this_00;
  MyLoadCustom *this_local;
  
  this_00 = (MyLoadCustom *)operator_new(0x60);
  MyLoadCustom(this_00,this);
  return this_00;
}

Assistant:

virtual MyLoadCustom* Clone() const override { return new MyLoadCustom(*this); }